

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void TestAlignmentForSize(int size)

{
  TestingPortal *pTVar1;
  ulong uVar2;
  void *pvVar3;
  undefined8 uVar4;
  char *pcVar5;
  int i;
  long lVar6;
  void *pvStack_348;
  void *ptrs [100];
  
  pTVar1 = tcmalloc::TestingPortal::Get();
  uVar2 = (**(code **)(*(long *)pTVar1 + 0x18))(pTVar1);
  lVar6 = 0;
  printf("Testing alignment of malloc(%d)\n",(ulong)(uint)size);
  do {
    pvVar3 = malloc((long)size);
    ptrs[lVar6 + -1] = pvVar3;
    if (((ulong)pvVar3 & 7) != 0) {
      pcVar5 = "Check failed: (p % sizeof(void*)) == 0\n";
      uVar4 = 0x27;
LAB_0010e3d5:
      syscall(1,2,pcVar5,uVar4);
      abort();
    }
    if ((uVar2 <= (ulong)(long)size) && ((ulong)pvVar3 % uVar2 != 0)) {
      pcVar5 = "Check failed: (p % min_align) == 0\n";
      uVar4 = 0x23;
      goto LAB_0010e3d5;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 100) {
      lVar6 = 0;
      do {
        free(ptrs[lVar6 + -1]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 100);
      return;
    }
  } while( true );
}

Assistant:

static void TestAlignmentForSize(int size) {
  const size_t min_align = TestingPortal::Get()->GetMinAlign();

  printf("Testing alignment of malloc(%d)\n", size);
  static const int kNum = 100;
  void* ptrs[kNum];
  for (int i = 0; i < kNum; i++) {
    ptrs[i] = malloc(size);
    uintptr_t p = reinterpret_cast<uintptr_t>(ptrs[i]);
    CHECK((p % sizeof(void*)) == 0);
    CHECK((p % sizeof(double)) == 0);

    // Must have 16-byte (or 8-byte in case of -DTCMALLOC_ALIGN_8BYTES)
    // alignment for large enough objects
    if (size >= min_align) {
      CHECK((p % min_align) == 0);
    }
  }
  for (int i = 0; i < kNum; i++) {
    free(ptrs[i]);
  }
}